

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buflist.c
# Opt level: O0

size_t lws_buflist_use_segment(lws_buflist **head,size_t len)

{
  lws_buflist *plVar1;
  int iVar2;
  lws_buflist *b;
  size_t len_local;
  lws_buflist **head_local;
  
  plVar1 = *head;
  if (plVar1 == (lws_buflist *)0x0) {
    __assert_fail("b",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dmikushin[P]libwebsockets/lib/core/buflist.c"
                  ,0x8f,"size_t lws_buflist_use_segment(struct lws_buflist **, size_t)");
  }
  if (len == 0) {
    __assert_fail("len",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dmikushin[P]libwebsockets/lib/core/buflist.c"
                  ,0x90,"size_t lws_buflist_use_segment(struct lws_buflist **, size_t)");
  }
  if (plVar1->len < plVar1->pos + len) {
    __assert_fail("b->pos + len <= b->len",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dmikushin[P]libwebsockets/lib/core/buflist.c"
                  ,0x91,"size_t lws_buflist_use_segment(struct lws_buflist **, size_t)");
  }
  plVar1->pos = plVar1->pos + len;
  if (plVar1->pos <= plVar1->len) {
    if (plVar1->pos < plVar1->len) {
      head_local = (lws_buflist **)(long)((int)plVar1->len - (int)plVar1->pos);
    }
    else {
      iVar2 = lws_buflist_destroy_segment(head);
      if (iVar2 == 0) {
        head_local = (lws_buflist **)lws_buflist_next_segment_len(head,(uint8_t **)0x0);
      }
      else {
        head_local = (lws_buflist **)0x0;
      }
    }
    return (size_t)head_local;
  }
  __assert_fail("b->pos <= b->len",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dmikushin[P]libwebsockets/lib/core/buflist.c"
                ,0x95,"size_t lws_buflist_use_segment(struct lws_buflist **, size_t)");
}

Assistant:

size_t
lws_buflist_use_segment(struct lws_buflist **head, size_t len)
{
	struct lws_buflist *b = (*head);

	assert(b);
	assert(len);
	assert(b->pos + len <= b->len);

	b->pos = b->pos + (size_t)len;

	assert(b->pos <= b->len);

	if (b->pos < b->len)
		return (int)(b->len - b->pos);

	if (lws_buflist_destroy_segment(head))
		/* last segment was just destroyed */
		return 0;

	return lws_buflist_next_segment_len(head, NULL);
}